

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O3

void __thiscall
TPZFront<float>::STensorProductMTData::~STensorProductMTData(STensorProductMTData *this)

{
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar1;
  TPZSemaphore *pTVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  this->fRunning = false;
  uVar5 = (uint)(this->fWorkSem).fNElements;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar3 = 0;
    do {
      TPZSemaphore::Post((TPZSemaphore *)((long)&((this->fWorkSem).fStore)->fCounter + lVar3));
      lVar3 = lVar3 + 0x60;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (0 < (int)uVar5) {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      lVar3 = 0;
      do {
        std::thread::join();
        operator_delete(*(void **)((long)(this->fThreadData).fStore + lVar3),0x10);
        *(undefined8 *)((long)(this->fThreadData).fStore + lVar3) = 0;
        lVar3 = lVar3 + 8;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  (this->fThreadData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0197fbb0;
  pppVar1 = (this->fThreadData).fStore;
  if (pppVar1 != (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0) {
    operator_delete__(pppVar1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->fThreads);
  (this->fWorkSem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0197fb60;
  pTVar2 = (this->fWorkSem).fStore;
  if (pTVar2 != (TPZSemaphore *)0x0) {
    lVar3 = *(long *)&pTVar2[-1].field_0x58;
    if (lVar3 != 0) {
      lVar4 = lVar3 * 0x60;
      do {
        std::condition_variable::~condition_variable
                  ((condition_variable *)((long)pTVar2 + lVar4 + -0x30));
        lVar4 = lVar4 + -0x60;
      } while (lVar4 != 0);
    }
    operator_delete__(&pTVar2[-1].field_0x58,lVar3 * 0x60 + 8);
  }
  std::condition_variable::~condition_variable(&(this->fWorkDoneSem).fCond);
  return;
}

Assistant:

~STensorProductMTData(){
			
			this->fRunning = false;
			const int nthreads = fWorkSem.NElements();
			for(int i = 0; i < nthreads; i++){
        fWorkSem[i].Post();
			}
			for(int i = 0; i < nthreads; i++){
        fThreads[i].join();
				delete fThreadData[i];
				fThreadData[i] = NULL;
			}
			
		}